

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O3

char * __thiscall
btCollisionShape::serialize(btCollisionShape *this,void *dataBuffer,btSerializer *serializer)

{
  undefined8 uVar1;
  long lVar2;
  
  uVar1 = (**(code **)(*(long *)serializer + 0x50))(serializer,this);
  lVar2 = (**(code **)(*(long *)serializer + 0x38))(serializer,uVar1);
  *(long *)dataBuffer = lVar2;
  if (lVar2 != 0) {
    (**(code **)(*(long *)serializer + 0x60))(serializer,uVar1);
  }
  *(int *)((long)dataBuffer + 8) = this->m_shapeType;
  return "btCollisionShapeData";
}

Assistant:

const char*	btCollisionShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btCollisionShapeData* shapeData = (btCollisionShapeData*) dataBuffer;
	char* name = (char*) serializer->findNameForPointer(this);
	shapeData->m_name = (char*)serializer->getUniquePointer(name);
	if (shapeData->m_name)
	{
		serializer->serializeName(name);
	}
	shapeData->m_shapeType = m_shapeType;
	//shapeData->m_padding//??
	return "btCollisionShapeData";
}